

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

PHY_ScalarType APhyBullet::mapHeightDataType(aphy_scalar_type type)

{
  aphy_scalar_type type_local;
  
  if (type != APHY_SCALAR_TYPE_UCHAR) {
    if (type == APHY_SCALAR_TYPE_SHORT) {
      return PHY_SHORT;
    }
    if (type == APHY_SCALAR_TYPE_FLOAT) {
      return PHY_FLOAT;
    }
  }
  return PHY_UCHAR;
}

Assistant:

inline PHY_ScalarType mapHeightDataType(aphy_scalar_type type)
{
    switch(type)
    {
    default:
    case APHY_SCALAR_TYPE_UCHAR: return PHY_UCHAR;
    case APHY_SCALAR_TYPE_SHORT: return PHY_SHORT;
    case APHY_SCALAR_TYPE_FLOAT: return PHY_FLOAT;
    }
}